

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O3

bool __thiscall CommandLineArguments::parse(CommandLineArguments *this,TestPlugin *plugin)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  char *parameterName;
  SimpleString argument;
  uint local_5c;
  SimpleString local_58;
  TestPlugin *local_48;
  SimpleString local_40;
  
  local_5c = 1;
  if (1 < this->ac_) {
    uVar3 = 1;
    local_48 = plugin;
    do {
      uVar1 = local_5c;
      SimpleString::SimpleString(&local_40,this->av_[(int)local_5c]);
      SimpleString::SimpleString(&local_58,"-h");
      bVar2 = operator==(&local_40,&local_58);
      SimpleString::~SimpleString(&local_58);
      if (bVar2) {
        this->needHelp_ = true;
LAB_0014480c:
        SimpleString::~SimpleString(&local_40);
        return false;
      }
      SimpleString::SimpleString(&local_58,"-v");
      bVar2 = operator==(&local_40,&local_58);
      SimpleString::~SimpleString(&local_58);
      if (bVar2) {
        this->verbose_ = true;
      }
      else {
        SimpleString::SimpleString(&local_58,"-vv");
        bVar2 = operator==(&local_40,&local_58);
        SimpleString::~SimpleString(&local_58);
        if (bVar2) {
          this->veryVerbose_ = true;
        }
        else {
          SimpleString::SimpleString(&local_58,"-c");
          bVar2 = operator==(&local_40,&local_58);
          SimpleString::~SimpleString(&local_58);
          if (bVar2) {
            this->color_ = true;
          }
          else {
            SimpleString::SimpleString(&local_58,"-p");
            bVar2 = operator==(&local_40,&local_58);
            SimpleString::~SimpleString(&local_58);
            if (bVar2) {
              this->runTestsAsSeperateProcess_ = true;
            }
            else {
              SimpleString::SimpleString(&local_58,"-b");
              bVar2 = operator==(&local_40,&local_58);
              SimpleString::~SimpleString(&local_58);
              if (bVar2) {
                this->reversing_ = true;
              }
              else {
                SimpleString::SimpleString(&local_58,"-lg");
                bVar2 = operator==(&local_40,&local_58);
                SimpleString::~SimpleString(&local_58);
                if (bVar2) {
                  this->listTestGroupNames_ = true;
                }
                else {
                  SimpleString::SimpleString(&local_58,"-ln");
                  bVar2 = operator==(&local_40,&local_58);
                  SimpleString::~SimpleString(&local_58);
                  if (bVar2) {
                    this->listTestGroupAndCaseNames_ = true;
                  }
                  else {
                    SimpleString::SimpleString(&local_58,"-ri");
                    bVar2 = operator==(&local_40,&local_58);
                    SimpleString::~SimpleString(&local_58);
                    if (bVar2) {
                      this->runIgnored_ = true;
                    }
                    else {
                      SimpleString::SimpleString(&local_58,"-r");
                      bVar2 = SimpleString::startsWith(&local_40,&local_58);
                      SimpleString::~SimpleString(&local_58);
                      if (bVar2) {
                        setRepeatCount(this,this->ac_,this->av_,(int *)&local_5c);
                      }
                      else {
                        SimpleString::SimpleString(&local_58,"-g");
                        bVar2 = SimpleString::startsWith(&local_40,&local_58);
                        SimpleString::~SimpleString(&local_58);
                        if (bVar2) {
                          addGroupFilter(this,this->ac_,this->av_,(int *)&local_5c);
                        }
                        else {
                          SimpleString::SimpleString(&local_58,"-t");
                          bVar2 = SimpleString::startsWith(&local_40,&local_58);
                          SimpleString::~SimpleString(&local_58);
                          if (bVar2) {
                            bVar2 = addGroupDotNameFilter(this,this->ac_,this->av_,(int *)&local_5c)
                            ;
                            uVar3 = (uint)bVar2;
                          }
                          else {
                            SimpleString::SimpleString(&local_58,"-sg");
                            bVar2 = SimpleString::startsWith(&local_40,&local_58);
                            SimpleString::~SimpleString(&local_58);
                            if (bVar2) {
                              addStrictGroupFilter(this,this->ac_,this->av_,(int *)&local_5c);
                            }
                            else {
                              SimpleString::SimpleString(&local_58,"-xg");
                              bVar2 = SimpleString::startsWith(&local_40,&local_58);
                              SimpleString::~SimpleString(&local_58);
                              if (bVar2) {
                                addExcludeGroupFilter(this,this->ac_,this->av_,(int *)&local_5c);
                              }
                              else {
                                SimpleString::SimpleString(&local_58,"-xsg");
                                bVar2 = SimpleString::startsWith(&local_40,&local_58);
                                SimpleString::~SimpleString(&local_58);
                                if (bVar2) {
                                  addExcludeStrictGroupFilter
                                            (this,this->ac_,this->av_,(int *)&local_5c);
                                }
                                else {
                                  SimpleString::SimpleString(&local_58,"-n");
                                  bVar2 = SimpleString::startsWith(&local_40,&local_58);
                                  SimpleString::~SimpleString(&local_58);
                                  if (bVar2) {
                                    addNameFilter(this,this->ac_,this->av_,(int *)&local_5c);
                                  }
                                  else {
                                    SimpleString::SimpleString(&local_58,"-sn");
                                    bVar2 = SimpleString::startsWith(&local_40,&local_58);
                                    SimpleString::~SimpleString(&local_58);
                                    if (bVar2) {
                                      addStrictNameFilter(this,this->ac_,this->av_,(int *)&local_5c)
                                      ;
                                    }
                                    else {
                                      SimpleString::SimpleString(&local_58,"-xn");
                                      bVar2 = SimpleString::startsWith(&local_40,&local_58);
                                      SimpleString::~SimpleString(&local_58);
                                      if (bVar2) {
                                        addExcludeNameFilter
                                                  (this,this->ac_,this->av_,(int *)&local_5c);
                                      }
                                      else {
                                        SimpleString::SimpleString(&local_58,"-xsn");
                                        bVar2 = SimpleString::startsWith(&local_40,&local_58);
                                        SimpleString::~SimpleString(&local_58);
                                        if (bVar2) {
                                          addExcludeStrictNameFilter
                                                    (this,this->ac_,this->av_,(int *)&local_5c);
                                        }
                                        else {
                                          SimpleString::SimpleString(&local_58,"-s");
                                          bVar2 = SimpleString::startsWith(&local_40,&local_58);
                                          SimpleString::~SimpleString(&local_58);
                                          if (bVar2) {
                                            bVar2 = setShuffle(this,this->ac_,this->av_,
                                                               (int *)&local_5c);
                                            uVar3 = (uint)bVar2;
                                          }
                                          else {
                                            SimpleString::SimpleString(&local_58,"TEST(");
                                            bVar2 = SimpleString::startsWith(&local_40,&local_58);
                                            SimpleString::~SimpleString(&local_58);
                                            parameterName = "TEST(";
                                            if (!bVar2) {
                                              SimpleString::SimpleString(&local_58,"IGNORE_TEST(");
                                              bVar2 = SimpleString::startsWith(&local_40,&local_58);
                                              SimpleString::~SimpleString(&local_58);
                                              parameterName = "IGNORE_TEST(";
                                              if (!bVar2) {
                                                SimpleString::SimpleString(&local_58,"-o");
                                                bVar2 = SimpleString::startsWith
                                                                  (&local_40,&local_58);
                                                SimpleString::~SimpleString(&local_58);
                                                if (bVar2) {
                                                  bVar2 = setOutputType(this,this->ac_,this->av_,
                                                                        (int *)&local_5c);
                                                  uVar3 = (uint)bVar2;
                                                }
                                                else {
                                                  SimpleString::SimpleString(&local_58,"-p");
                                                  bVar2 = SimpleString::startsWith
                                                                    (&local_40,&local_58);
                                                  SimpleString::~SimpleString(&local_58);
                                                  if (bVar2) {
                                                    uVar3 = (*local_48->_vptr_TestPlugin[7])
                                                                      (local_48,(ulong)(uint)this->
                                                  ac_,this->av_,(ulong)uVar1);
                                                  }
                                                  else {
                                                    SimpleString::SimpleString(&local_58,"-k");
                                                    bVar2 = SimpleString::startsWith
                                                                      (&local_40,&local_58);
                                                    SimpleString::~SimpleString(&local_58);
                                                    if (!bVar2) goto LAB_0014480c;
                                                    setPackageName(this,this->ac_,this->av_,
                                                                   (int *)&local_5c);
                                                  }
                                                }
                                                goto LAB_00144716;
                                              }
                                            }
                                            addTestToRunBasedOnVerboseOutput
                                                      (this,this->ac_,this->av_,(int *)&local_5c,
                                                       parameterName);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00144716:
      SimpleString::~SimpleString(&local_40);
      if ((uVar3 & 1) == 0) {
        return false;
      }
      local_5c = local_5c + 1;
    } while ((int)local_5c < this->ac_);
  }
  return true;
}

Assistant:

bool CommandLineArguments::parse(TestPlugin* plugin)
{
    bool correctParameters = true;
    for (int i = 1; i < ac_; i++) {
        SimpleString argument = av_[i];

        if (argument == "-h") {
            needHelp_ = true;
            correctParameters = false;
        }
        else if (argument == "-v") verbose_ = true;
        else if (argument == "-vv") veryVerbose_ = true;
        else if (argument == "-c") color_ = true;
        else if (argument == "-p") runTestsAsSeperateProcess_ = true;
        else if (argument == "-b") reversing_ = true;
        else if (argument == "-lg") listTestGroupNames_ = true;
        else if (argument == "-ln") listTestGroupAndCaseNames_ = true;
        else if (argument == "-ri") runIgnored_ = true;
        else if (argument.startsWith("-r")) setRepeatCount(ac_, av_, i);
        else if (argument.startsWith("-g")) addGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-t")) correctParameters = addGroupDotNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sg")) addStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xg")) addExcludeGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xsg")) addExcludeStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-n")) addNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sn")) addStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xn")) addExcludeNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xsn")) addExcludeStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-s")) correctParameters = setShuffle(ac_, av_, i);
        else if (argument.startsWith("TEST(")) addTestToRunBasedOnVerboseOutput(ac_, av_, i, "TEST(");
        else if (argument.startsWith("IGNORE_TEST(")) addTestToRunBasedOnVerboseOutput(ac_, av_, i, "IGNORE_TEST(");
        else if (argument.startsWith("-o")) correctParameters = setOutputType(ac_, av_, i);
        else if (argument.startsWith("-p")) correctParameters = plugin->parseAllArguments(ac_, av_, i);
        else if (argument.startsWith("-k")) setPackageName(ac_, av_, i);
        else correctParameters = false;

        if (correctParameters == false) {
            return false;
        }
    }
    return true;
}